

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.hpp
# Opt level: O0

void __thiscall
ProgramContext::error<SyntaxTree,char_const*&,unsigned_long&>
          (ProgramContext *this,SyntaxTree *context,char *msg,char **args,unsigned_long *args_1)

{
  __int_type _Var1;
  string local_50;
  unsigned_long *local_30;
  unsigned_long *args_local_1;
  char **args_local;
  char *msg_local;
  SyntaxTree *context_local;
  ProgramContext *this_local;
  
  local_30 = args_1;
  args_local_1 = (unsigned_long *)args;
  args_local = (char **)msg;
  msg_local = (char *)context;
  context_local = (SyntaxTree *)this;
  if (this->logstream != (FILE *)0x0) {
    format_error<char_const*&,unsigned_long&>(&local_50,&this->opt,"error",context,msg,args,args_1);
    puts(this,(char *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  _Var1 = std::__atomic_base<unsigned_int>::operator++
                    (&(this->error_count).super___atomic_base<unsigned_int>);
  if (this->max_error <= _Var1) {
    fatal_error<tag_nocontext_t>(this,(tag_nocontext_t *)&nocontext,"too many errors");
  }
  return;
}

Assistant:

void error(const Context& context, const char* msg, Args&&... args)
    {
        if(logstream) this->puts(format_error(this->opt, "error", context, msg, std::forward<Args>(args)...));

        if(++error_count >= max_error)
            this->fatal_error(nocontext, "too many errors");
    }